

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *__s;
  size_t sVar8;
  Vec_Int_t *p;
  int *piVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  int local_4c;
  
  __s = Extra_FileReadContents(pFileName);
  sVar8 = strlen(__s);
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  iVar7 = vNames->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar6 = iVar7;
  }
  p->nSize = 0;
  p->nCap = iVar6;
  bVar3 = false;
  if (iVar6 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar6 << 2);
  }
  p->pArray = piVar9;
  local_4c = -1;
  bVar4 = true;
  pcVar11 = __s;
  do {
    cVar2 = *pcVar11;
    if (cVar2 == '\n') {
      bVar3 = false;
    }
    else if (cVar2 == '\0') {
      if (p->nSize == vNames->nSize * 2) {
        free(__s);
        return p;
      }
      __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                    ,0x40e,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
    }
    if ((cVar2 == '/') && (pcVar11[1] == '/')) {
      bVar3 = true;
    }
    if (!bVar3) {
      if (cVar2 == '(') {
        bVar5 = !bVar4;
        bVar4 = false;
        if (bVar5) {
          pcVar11 = strtok(pcVar11 + 1,"  \n\r\t,");
          if (0 < vNames->nSize) {
            lVar12 = 0;
            do {
              iVar7 = strcmp((char *)vNames->pArray[lVar12],pcVar11);
              if (iVar7 == 0) {
                Vec_IntPush(p,local_4c);
                Vec_IntPush(p,(int)lVar12);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < vNames->nSize);
          }
          sVar10 = strlen(pcVar11);
          pcVar11 = pcVar11 + (sVar10 - 1);
          do {
            pcVar1 = pcVar11 + 1;
            pcVar11 = pcVar11 + 1;
          } while (*pcVar1 == '\0');
          if (__s + sVar8 <= pcVar11) {
            __assert_fail("pTemp < pLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                          ,0x40a,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
          }
        }
      }
      else if (cVar2 == '\n') {
        local_4c = ((int)pcVar11 - (int)__s) + 1;
      }
    }
    pcVar11 = pcVar11 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1, fComment = 0;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            fComment = 0;
        if ( *pTemp == '/' && *(pTemp + 1) == '/' )
            fComment = 1;
        if ( fComment )
            continue;

        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t," );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}